

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-interp.cc
# Opt level: O0

Result __thiscall
wabt::interp::anon_unknown_0::BinaryReaderInterp::OnTable
          (BinaryReaderInterp *this,Index index,Type elem_type,Limits *elem_limits)

{
  ModuleDesc *pMVar1;
  bool bVar2;
  TableType local_a0;
  uint64_t local_78;
  uint64_t local_70;
  undefined8 local_68;
  Enum local_5c;
  undefined1 local_58 [8];
  TableType table_type;
  Limits *elem_limits_local;
  Index index_local;
  BinaryReaderInterp *this_local;
  Type elem_type_local;
  
  table_type.limits._16_4_ = elem_type.enum_;
  this_local._0_4_ = elem_type.enum_;
  table_type.limits._20_4_ =
       SharedValidator::OnTable
                 (&this->validator_,(Location *)(anonymous_namespace)::BinaryReaderInterp::loc,
                  elem_type,elem_limits);
  bVar2 = Failed((Result)table_type.limits._20_4_);
  if (bVar2) {
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  else {
    local_5c = this_local._0_4_;
    local_78 = elem_limits->initial;
    local_70 = elem_limits->max;
    local_68._0_1_ = elem_limits->has_max;
    local_68._1_1_ = elem_limits->is_shared;
    local_68._2_6_ = *(undefined6 *)&elem_limits->field_0x12;
    TableType::TableType((TableType *)local_58,(ValueType)this_local._0_4_,*elem_limits);
    pMVar1 = this->module_;
    TableType::TableType(&local_a0,(TableType *)local_58);
    std::vector<wabt::interp::TableDesc,_std::allocator<wabt::interp::TableDesc>_>::push_back
              (&pMVar1->tables,(value_type *)&local_a0);
    TableDesc::~TableDesc((TableDesc *)&local_a0);
    std::vector<wabt::interp::TableType,_std::allocator<wabt::interp::TableType>_>::push_back
              (&this->table_types_,(value_type *)local_58);
    Result::Result((Result *)((long)&this_local + 4),Ok);
    TableType::~TableType((TableType *)local_58);
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result BinaryReaderInterp::OnTable(Index index,
                                   Type elem_type,
                                   const Limits* elem_limits) {
  CHECK_RESULT(validator_.OnTable(loc, elem_type, *elem_limits));
  TableType table_type{elem_type, *elem_limits};
  module_.tables.push_back(TableDesc{table_type});
  table_types_.push_back(table_type);
  return Result::Ok;
}